

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O1

void __thiscall indk::Neuron::setLearned(Neuron *this,bool LearnedFlag)

{
  pointer ppRVar1;
  iterator __begin2;
  pointer ppRVar2;
  undefined3 in_register_00000031;
  iterator __end2;
  
  this->Learned = LearnedFlag;
  ppRVar2 = (this->Receptors).
            super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppRVar1 = (this->Receptors).
            super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (CONCAT31(in_register_00000031,LearnedFlag) == 0) {
    for (; ppRVar2 != ppRVar1; ppRVar2 = ppRVar2 + 1) {
      Receptor::doUnlock(*ppRVar2);
    }
  }
  else {
    for (; ppRVar2 != ppRVar1; ppRVar2 = ppRVar2 + 1) {
      Receptor::doLock(*ppRVar2);
    }
  }
  return;
}

Assistant:

void indk::Neuron::setLearned(bool LearnedFlag) {
    Learned = LearnedFlag;

    if (Learned)
        for (auto R: Receptors) R -> doLock();
    else
        for (auto R: Receptors) R -> doUnlock();
}